

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall llm_tokenizer_rwkv::~llm_tokenizer_rwkv(llm_tokenizer_rwkv *this)

{
  llm_tokenizer *in_RDI;
  
  in_RDI->_vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_rwkv_00644338;
  naive_trie::~naive_trie((naive_trie *)0x5562ca);
  llm_tokenizer::~llm_tokenizer(in_RDI);
  return;
}

Assistant:

llm_tokenizer_rwkv(const llama_vocab & vocab) {
        // RWKV supports arbitrary byte tokens, but the vocab struct only supports string tokens.
        // For now, we decode the vocab here into the lookup we'll use for tokenization.

        // build trie
        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & data = vocab.get_token_data(id);
            const auto text = llama_unescape_rwkv_token(data.text);
            token_matcher.insert((const char *) text.data(), text.size(), id);
        }
    }